

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
EagerPromiseNode<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>_>
::~EagerPromiseNode(EagerPromiseNode<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>_>
                    *this)

{
  EagerPromiseNode<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>_>
  *this_local;
  
  ExceptionOr<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>_>
  ::~ExceptionOr(&this->result);
  EagerPromiseNodeBase::~EagerPromiseNodeBase(&this->super_EagerPromiseNodeBase);
  return;
}

Assistant:

EagerPromiseNode(Own<PromiseNode>&& dependency)
      : EagerPromiseNodeBase(kj::mv(dependency), result) {}